

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadBlockMap(MapData *map)

{
  size_t __n;
  FileReader *pFVar1;
  int iVar2;
  short *psVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char *format;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  pFVar1 = map->MapLumps[10].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = (int)pFVar1->Length;
  }
  if ((((!ForceNodeBuild) && (!genblockmap.Value)) && (iVar9 != 0 && iVar9 < 0x20000)) &&
     (iVar2 = DArgs::CheckParm(Args,"-blockmap",1), iVar2 == 0)) {
    uVar7 = iVar9 / 2;
    psVar3 = (short *)operator_new__((long)iVar9);
    pFVar1 = map->MapLumps[10].Reader;
    lVar11 = pFVar1->Length;
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,psVar3,(long)(int)lVar11)
    ;
    uVar5 = 0xffffffffffffffff;
    if (-2 < iVar9) {
      uVar5 = (long)(int)uVar7 * 4;
    }
    piVar4 = (int *)operator_new__(uVar5);
    blockmaplump = piVar4;
    *piVar4 = (int)*psVar3;
    piVar4[1] = (int)psVar3[1];
    piVar4[2] = (uint)(ushort)psVar3[2];
    piVar4[3] = (uint)(ushort)psVar3[3];
    if (9 < iVar9) {
      uVar5 = 5;
      if (5 < (int)uVar7) {
        uVar5 = (ulong)uVar7;
      }
      uVar6 = 4;
      do {
        uVar8 = (uint)(ushort)psVar3[uVar6];
        if (uVar8 == 0xffff) {
          uVar8 = 0xffffffff;
        }
        piVar4[uVar6] = uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    operator_delete__(psVar3);
    uVar5 = (ulong)blockmaplump[3];
    bVar12 = (long)uVar5 < 1;
    if (0 < (long)uVar5) {
      uVar8 = blockmaplump[2];
      uVar6 = 0;
      format = "P_VerifyBlockMap: block offset overflow\n";
      bVar12 = false;
      do {
        if (0 < (int)uVar8) {
          uVar10 = 0;
          do {
            if (blockmaplump + (int)uVar7 <= blockmaplump + uVar6 * uVar8 + uVar10 + 4) {
LAB_00449bde:
              Printf(2,format);
              goto LAB_00449bea;
            }
            iVar9 = blockmaplump[uVar6 * uVar8 + uVar10 + 4];
            lVar11 = (long)iVar9;
            if ((lVar11 < 4) || ((int)uVar7 <= iVar9)) {
              format = "P_VerifyBlockMap: list offset overflow\n";
              goto LAB_00449bde;
            }
            piVar4 = blockmaplump + lVar11;
            while (*piVar4 != -1) {
              piVar4 = piVar4 + 1;
              if (blockmaplump + (int)uVar7 <= piVar4) {
                format = "P_VerifyBlockMap: open blocklist\n";
                goto LAB_00449bde;
              }
            }
            iVar9 = blockmaplump[lVar11];
            if (iVar9 != -1) {
              piVar4 = blockmaplump + lVar11 + 1;
              do {
                if ((iVar9 < 0) || (numlines <= iVar9)) {
                  format = "P_VerifyBlockMap: index >= numlines\n";
                  goto LAB_00449bde;
                }
                iVar9 = *piVar4;
                piVar4 = piVar4 + 1;
              } while (iVar9 != -1);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar8);
        }
        uVar6 = uVar6 + 1;
        bVar12 = uVar5 <= uVar6;
      } while (uVar6 != uVar5);
    }
LAB_00449bea:
    if (bVar12) goto LAB_00449c07;
  }
  DPrintf(4,"Generating BLOCKMAP\n");
  P_CreateBlockMap();
LAB_00449c07:
  piVar4 = blockmaplump;
  bmaporgx = (double)*blockmaplump;
  bmaporgy = (double)blockmaplump[1];
  bmapwidth = blockmaplump[2];
  bmapheight = blockmaplump[3];
  __n = (long)(bmapheight * bmapwidth) * 8;
  uVar5 = 0xffffffffffffffff;
  if (-1 < bmapheight * bmapwidth) {
    uVar5 = __n;
  }
  blocklinks = (FBlockNode **)operator_new__(uVar5);
  memset(blocklinks,0,__n);
  blockmap = piVar4 + 4;
  return;
}

Assistant:

void P_LoadBlockMap (MapData * map)
{
	int count = map->Size(ML_BLOCKMAP);

	if (ForceNodeBuild || genblockmap ||
		count/2 >= 0x10000 || count == 0 ||
		Args->CheckParm("-blockmap")
		)
	{
		DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
		P_CreateBlockMap ();
	}
	else
	{
		BYTE *data = new BYTE[count];
		map->Read(ML_BLOCKMAP, data);
		const short *wadblockmaplump = (short *)data;
		int i;

		count/=2;
		blockmaplump = new int[count];

		// killough 3/1/98: Expand wad blockmap into larger internal one,
		// by treating all offsets except -1 as unsigned and zero-extending
		// them. This potentially doubles the size of blockmaps allowed,
		// because Doom originally considered the offsets as always signed.

		blockmaplump[0] = LittleShort(wadblockmaplump[0]);
		blockmaplump[1] = LittleShort(wadblockmaplump[1]);
		blockmaplump[2] = (DWORD)(LittleShort(wadblockmaplump[2])) & 0xffff;
		blockmaplump[3] = (DWORD)(LittleShort(wadblockmaplump[3])) & 0xffff;

		for (i = 4; i < count; i++)
		{
			short t = LittleShort(wadblockmaplump[i]);          // killough 3/1/98
			blockmaplump[i] = t == -1 ? (DWORD)0xffffffff : (DWORD) t & 0xffff;
		}
		delete[] data;

		if (!P_VerifyBlockMap(count))
		{
			DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
			P_CreateBlockMap();
		}

	}

	bmaporgx = blockmaplump[0];
	bmaporgy = blockmaplump[1];
	bmapwidth = blockmaplump[2];
	bmapheight = blockmaplump[3];

	// clear out mobj chains
	count = bmapwidth*bmapheight;
	blocklinks = new FBlockNode *[count];
	memset (blocklinks, 0, count*sizeof(*blocklinks));
	blockmap = blockmaplump+4;
}